

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::detail::
case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
::operator=(case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            *this,char ch)

{
  undefined8 in_RDX;
  char in_SIL;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  transform_op tVar1;
  transform_op tVar2;
  
  if (in_RDI->next_ == op_none) {
    tVar1 = in_RDI->rest_;
  }
  else {
    tVar1 = in_RDI->next_;
  }
  tVar2 = tVar1;
  if (tVar1 == op_upper) {
    (*in_RDI->traits_->_vptr_traits[3])(in_RDI->traits_,(ulong)(uint)(int)in_SIL,in_RDX,in_SIL);
  }
  else if (tVar1 == op_lower) {
    (*in_RDI->traits_->_vptr_traits[2])(in_RDI->traits_,(ulong)(uint)(int)in_SIL,in_RDX,in_SIL);
  }
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator*(&in_RDI->out_);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(tVar2,tVar1),in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

case_converting_iterator &operator =(Char ch)
    {
        switch(this->next_ ? this->next_ : this->rest_)
        {
        case op_lower:
            ch = this->traits_->tolower(ch);
            break;

        case op_upper:
            ch = this->traits_->toupper(ch);
            break;

        default:;
        }

        *this->out_ = ch;
        return *this;
    }